

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ElsePropertyClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ElsePropertyClauseSyntax,slang::parsing::Token&,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,Token *args,PropertyExprSyntax *args_1)

{
  Token elseKeyword;
  ElsePropertyClauseSyntax *this_00;
  PropertyExprSyntax *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ElsePropertyClauseSyntax *)allocate(this,0x28,8);
  elseKeyword.kind = args->kind;
  elseKeyword._2_1_ = args->field_0x2;
  elseKeyword.numFlags.raw = (args->numFlags).raw;
  elseKeyword.rawLen = args->rawLen;
  elseKeyword.info = args->info;
  slang::syntax::ElsePropertyClauseSyntax::ElsePropertyClauseSyntax(this_00,elseKeyword,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }